

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

SpatialInertia * __thiscall iDynTree::Transform::operator*(Transform *this,SpatialInertia *op2)

{
  SpatialInertia *in_RDI;
  SpatialInertia *in_stack_00000280;
  Transform *in_stack_00000288;
  
  transform<iDynTree::SpatialInertia>(in_stack_00000288,in_stack_00000280);
  return in_RDI;
}

Assistant:

SpatialInertia Transform::operator*(const SpatialInertia& op2) const
{
    return transform<SpatialInertia>(*this,op2);
}